

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool ON_SubDEdgeSharpness::EqualDelta(ON_SubDEdgeSharpness s0,ON_SubDEdgeSharpness s1)

{
  double dVar1;
  double dVar2;
  bool local_39;
  double d;
  double delta1;
  double delta0;
  ON_SubDEdgeSharpness s1_local;
  ON_SubDEdgeSharpness s0_local;
  
  s1_local.m_edge_sharpness[1] = s0.m_edge_sharpness[1];
  delta0._4_4_ = s1.m_edge_sharpness[0];
  if (s1_local.m_edge_sharpness[1] == delta0._4_4_) {
    unique0x100001b6 = s1.m_edge_sharpness;
    s1_local = s0;
    dVar1 = Delta(&s1_local);
    dVar2 = Delta((ON_SubDEdgeSharpness *)((long)&delta0 + 4));
    if (((dVar1 == 0.0) && (!NAN(dVar1))) || ((dVar2 == 0.0 && (!NAN(dVar2))))) {
      local_39 = false;
      if ((dVar1 == 0.0) && (!NAN(dVar1))) {
        local_39 = dVar2 == 0.0;
      }
      s0_local.m_edge_sharpness[0]._3_1_ = local_39;
    }
    else {
      s0_local.m_edge_sharpness[0]._3_1_ = ABS(dVar1 - dVar2) <= 0.01;
    }
  }
  else {
    s0_local.m_edge_sharpness[0]._3_1_ = false;
  }
  return s0_local.m_edge_sharpness[0]._3_1_;
}

Assistant:

bool ON_SubDEdgeSharpness::EqualDelta(
  ON_SubDEdgeSharpness s0,
  ON_SubDEdgeSharpness s1
)
{
  if (false == (s0.m_edge_sharpness[1] == s1.m_edge_sharpness[0]))
    return false;
  
  const double delta0 = s0.Delta();
  const double delta1 = s1.Delta();

  if (0.0 != delta0 && 0.0 != delta1)
  {
    // fuzzy compare for nonzero deltas
    const double d = fabs(delta0 - delta1);
    return (d <= ON_SubDEdgeSharpness::Tolerance);
  }

  // strict compare for zero deltas.
  return 0.0 == delta0 && 0.0 == delta1;
}